

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

value_type * __thiscall
QList<Symbol>::takeLast(value_type *__return_storage_ptr__,QList<Symbol> *this)

{
  iterator iVar1;
  
  __return_storage_ptr__->from = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->len = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->lex).d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->lex).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)__return_storage_ptr__ = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->lex).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  iVar1 = end(this);
  Symbol::Symbol(__return_storage_ptr__,iVar1.i + -1);
  QtPrivate::QGenericArrayOps<Symbol>::eraseLast((QGenericArrayOps<Symbol> *)this);
  return __return_storage_ptr__;
}

Assistant:

value_type takeLast() { Q_ASSERT(!isEmpty()); value_type v = std::move(last()); d->eraseLast(); return v; }